

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O1

bool __thiscall SubprocessSet::DoWork(SubprocessSet *this)

{
  iterator *piVar1;
  pointer *pppSVar2;
  uint uVar3;
  pointer ppSVar4;
  _Elt_pointer ppSVar5;
  int iVar6;
  pointer ppSVar7;
  int *piVar8;
  fd_set *__arr;
  pointer __src;
  fd_set set;
  fd_set local_98;
  
  local_98.fds_bits[0xe] = 0;
  local_98.fds_bits[0xf] = 0;
  local_98.fds_bits[0xc] = 0;
  local_98.fds_bits[0xd] = 0;
  local_98.fds_bits[10] = 0;
  local_98.fds_bits[0xb] = 0;
  local_98.fds_bits[8] = 0;
  local_98.fds_bits[9] = 0;
  local_98.fds_bits[6] = 0;
  local_98.fds_bits[7] = 0;
  local_98.fds_bits[4] = 0;
  local_98.fds_bits[5] = 0;
  local_98.fds_bits[2] = 0;
  local_98.fds_bits[3] = 0;
  local_98.fds_bits[0] = 0;
  local_98.fds_bits[1] = 0;
  ppSVar4 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  iVar6 = 0;
  for (ppSVar7 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppSVar7 != ppSVar4; ppSVar7 = ppSVar7 + 1
      ) {
    uVar3 = (*ppSVar7)->fd_;
    if (-1 < (int)uVar3) {
      local_98.fds_bits[uVar3 >> 6] = local_98.fds_bits[uVar3 >> 6] | 1L << ((byte)uVar3 & 0x3f);
      if (iVar6 <= (int)uVar3) {
        iVar6 = uVar3 + 1;
      }
    }
  }
  interrupted_ = 0;
  iVar6 = pselect(iVar6,&local_98,(fd_set *)0x0,(fd_set *)0x0,(timespec *)0x0,
                  (__sigset_t *)&this->old_mask_);
  if (iVar6 == -1) {
    piVar8 = __errno_location();
    if (*piVar8 != 4) {
      perror("ninja: pselect");
      return false;
    }
  }
  else {
    HandlePendingInterruption();
    if (interrupted_ != 0) {
      return true;
    }
    ppSVar7 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar7 !=
        (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        uVar3 = (*ppSVar7)->fd_;
        if (((int)uVar3 < 0) ||
           (((ulong)local_98.fds_bits[uVar3 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
LAB_0011e060:
          ppSVar7 = ppSVar7 + 1;
        }
        else {
          Subprocess::OnPipeReady(*ppSVar7);
          if ((*ppSVar7)->fd_ != -1) goto LAB_0011e060;
          ppSVar5 = (this->finished_).c.
                    super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (ppSVar5 ==
              (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<Subprocess*,std::allocator<Subprocess*>>::_M_push_back_aux<Subprocess*const&>
                      ((deque<Subprocess*,std::allocator<Subprocess*>> *)&this->finished_,ppSVar7);
          }
          else {
            *ppSVar5 = *ppSVar7;
            piVar1 = &(this->finished_).c.
                      super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                      super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
          __src = ppSVar7 + 1;
          ppSVar4 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (__src != ppSVar4) {
            memmove(ppSVar7,__src,(long)ppSVar4 - (long)__src);
          }
          pppSVar2 = &(this->running_).
                      super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppSVar2 = *pppSVar2 + -1;
        }
      } while (ppSVar7 !=
               (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return interrupted_ != 0;
}

Assistant:

bool SubprocessSet::DoWork() {
  fd_set set;
  int nfds = 0;
  FD_ZERO(&set);

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ++i) {
    int fd = (*i)->fd_;
    if (fd >= 0) {
      FD_SET(fd, &set);
      if (nfds < fd+1)
        nfds = fd+1;
    }
  }

  interrupted_ = 0;
  int ret = pselect(nfds, &set, 0, 0, 0, &old_mask_);
  if (ret == -1) {
    if (errno != EINTR) {
      perror("ninja: pselect");
      return false;
    }
    return IsInterrupted();
  }

  HandlePendingInterruption();
  if (IsInterrupted())
    return true;

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ) {
    int fd = (*i)->fd_;
    if (fd >= 0 && FD_ISSET(fd, &set)) {
      (*i)->OnPipeReady();
      if ((*i)->Done()) {
        finished_.push(*i);
        i = running_.erase(i);
        continue;
      }
    }
    ++i;
  }

  return IsInterrupted();
}